

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O1

void __thiscall
Diligent::VulkanDynamicMemoryManager::~VulkanDynamicMemoryManager(VulkanDynamicMemoryManager *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined7 in_stack_ffffffffffffff88;
  string msg;
  undefined4 local_4c;
  double local_48;
  OffsetType local_40;
  char local_38 [8];
  OffsetType local_30;
  OffsetType local_28;
  char local_20 [8];
  char local_18 [8];
  
  if ((this->m_VkBuffer).m_VkObject != (VkBuffer_T *)0x0 ||
      (this->m_BufferMemory).m_VkObject != (VkDeviceMemory_T *)0x0) {
    FormatString<char[60]>
              (&msg,(char (*) [60])"Vulkan resources must be explicitly released with Destroy()");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"~VulkanDynamicMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x82);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  local_30 = (this->super_MasterBlockListBasedManager).m_AllocationsMgr.m_MaxSize;
  local_20[0] = '\x02';
  local_20[1] = '\0';
  local_20[2] = '\0';
  local_20[3] = '\0';
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  local_40 = this->m_TotalPeakSize;
  local_38[0] = '\x02';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_4c = 1;
  auVar2._8_4_ = (int)(local_40 >> 0x20);
  auVar2._0_8_ = local_40;
  auVar2._12_4_ = 0x45300000;
  lVar1 = local_30 + (local_30 == 0);
  auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar3._0_8_ = lVar1;
  auVar3._12_4_ = 0x45300000;
  local_48 = (((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0)) /
             ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) * 100.0;
  local_28 = local_30;
  FormatString<char[72],Diligent::MemorySizeFormatter<unsigned_long>,char[24],Diligent::MemorySizeFormatter<unsigned_long>,char[21],std::ios_base&(std::ios_base&),std::_Setprecision,double,char>
            (&msg,(Diligent *)
                  "Dynamic memory manager usage stats:\n                       Total size: ",
             (char (*) [72])&local_28,
             (MemorySizeFormatter<unsigned_long> *)". Peak allocated size: ",
             (char (*) [24])&local_40,(MemorySizeFormatter<unsigned_long> *)". Peak utilization: ",
             (char (*) [21])std::fixed,(_func_ios_base_ptr_ios_base_ptr *)&local_4c,
             (_Setprecision *)&local_48,(double *)&stack0xffffffffffffff8f,
             (char *)CONCAT17(0x25,in_stack_ffffffffffffff88));
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != &msg.field_2) {
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
  }
  VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  ~VulkanObjectWrapper(&this->m_BufferMemory);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper(&this->m_VkBuffer);
  DynamicHeap::MasterBlockListBasedManager::~MasterBlockListBasedManager
            (&this->super_MasterBlockListBasedManager);
  return;
}

Assistant:

VulkanDynamicMemoryManager::~VulkanDynamicMemoryManager()
{
    VERIFY(m_BufferMemory == VK_NULL_HANDLE && m_VkBuffer == VK_NULL_HANDLE, "Vulkan resources must be explicitly released with Destroy()");
    auto Size = GetSize();
    LOG_INFO_MESSAGE("Dynamic memory manager usage stats:\n"
                     "                       Total size: ",
                     FormatMemorySize(Size, 2),
                     ". Peak allocated size: ", FormatMemorySize(m_TotalPeakSize, 2, Size),
                     ". Peak utilization: ",
                     std::fixed, std::setprecision(1), static_cast<double>(m_TotalPeakSize) / static_cast<double>(std::max(Size, size_t{1})) * 100.0, '%');
}